

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeVerifyNamedSchema(Parse *pParse,char *zDb)

{
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  char *in_RSI;
  long *in_RDI;
  Db *pDb;
  int i;
  sqlite3 *db;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  lVar1 = *in_RDI;
  iVar4 = 0;
  do {
    if (*(int *)(lVar1 + 0x28) <= iVar4) {
      return;
    }
    puVar3 = (undefined8 *)(*(long *)(lVar1 + 0x20) + (long)iVar4 * 0x20);
    if (puVar3[1] != 0) {
      if (in_RSI != (char *)0x0) {
        iVar2 = sqlite3StrICmp(in_RSI,(char *)*puVar3);
        if (iVar2 != 0) goto LAB_001e551c;
      }
      sqlite3CodeVerifySchema
                ((Parse *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),(int)((ulong)puVar3 >> 0x20));
    }
LAB_001e551c:
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifyNamedSchema(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  int i;
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pBt && (!zDb || 0==sqlite3StrICmp(zDb, pDb->zDbSName)) ){
      sqlite3CodeVerifySchema(pParse, i);
    }
  }
}